

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O0

void canvas_dopaste(_glist *x,_binbuf *b)

{
  _class **pp_Var1;
  _class **pp_Var2;
  _class **pp_Var3;
  int oldstate;
  t_symbol *ptVar4;
  t_pd *boundn;
  t_pd *bounda;
  t_pd *boundx;
  t_symbol *asym;
  int local_28;
  int count;
  int nbox;
  int dspstate;
  t_gobj *g2;
  _binbuf *b_local;
  _glist *x_local;
  
  oldstate = canvas_suspend_dsp();
  ptVar4 = gensym("#A");
  pp_Var3 = s__X.s_thing;
  pp_Var2 = s__N.s_thing;
  pp_Var1 = ptVar4->s_thing;
  ptVar4->s_thing = (_class **)0x0;
  s__N.s_thing = &pd_canvasmaker;
  s__X.s_thing = (_class **)x;
  canvas_editmode(x,1.0);
  glist_noselect(x);
  _nbox = x->gl_list;
  local_28 = 0;
  for (; _nbox != (t_gobj *)0x0; _nbox = _nbox->g_next) {
    local_28 = local_28 + 1;
  }
  *(int *)((pd_maininstance.pd_gui)->i_editor + 0x68) = local_28;
  *(_glist **)((pd_maininstance.pd_gui)->i_editor + 0x70) = x;
  binbuf_eval(b,(t_pd *)0x0,0,(t_atom *)0x0);
  _nbox = x->gl_list;
  asym._4_4_ = 0;
  for (; _nbox != (t_gobj *)0x0; _nbox = _nbox->g_next) {
    if (local_28 <= asym._4_4_) {
      glist_select(x,_nbox);
    }
    asym._4_4_ = asym._4_4_ + 1;
  }
  *(undefined8 *)((pd_maininstance.pd_gui)->i_editor + 0x70) = 0;
  canvas_resume_dsp(oldstate);
  canvas_dirty(x,1.0);
  if ((*(ushort *)&x->field_0xe8 >> 1 & 1) != 0) {
    pdgui_vmess("pdtk_canvas_getscroll","c",x);
  }
  if (sys_noloadbang == 0) {
    glist_donewloadbangs(x);
  }
  ptVar4->s_thing = pp_Var1;
  s__X.s_thing = pp_Var3;
  s__N.s_thing = pp_Var2;
  return;
}

Assistant:

static void canvas_dopaste(t_canvas *x, t_binbuf *b)
{
    t_gobj *g2;
    int dspstate = canvas_suspend_dsp(), nbox, count;
    t_symbol *asym = gensym("#A");
        /* save and clear bindings to symbols #A, #N, #X; restore when done */
    t_pd *boundx = s__X.s_thing, *bounda = asym->s_thing,
        *boundn = s__N.s_thing;
    asym->s_thing = 0;
    s__X.s_thing = &x->gl_pd;
    s__N.s_thing = &pd_canvasmaker;

    canvas_editmode(x, 1.);
    glist_noselect(x);
    for (g2 = x->gl_list, nbox = 0; g2; g2 = g2->g_next) nbox++;

    EDITOR->paste_onset = nbox;
    EDITOR->paste_canvas = x;

    binbuf_eval(b, 0, 0, 0);
    for (g2 = x->gl_list, count = 0; g2; g2 = g2->g_next, count++)
        if (count >= nbox)
            glist_select(x, g2);
    EDITOR->paste_canvas = 0;
    canvas_resume_dsp(dspstate);
    canvas_dirty(x, 1);
    if (x->gl_mapped)
        pdgui_vmess("pdtk_canvas_getscroll", "c", x);
    if (!sys_noloadbang)
        glist_donewloadbangs(x);
    asym->s_thing = bounda;
    s__X.s_thing = boundx;
    s__N.s_thing = boundn;
}